

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O0

void __thiscall OPL3::SetPanning(OPL3 *this,int c,float left,float right)

{
  Channel *local_28;
  Channel *channel;
  float right_local;
  float left_local;
  int c_local;
  OPL3 *this_local;
  
  if ((this->FullPan & 1U) != 0) {
    if (c < 9) {
      local_28 = this->channels[0][c];
    }
    else {
      local_28 = (Channel *)(this->disabledChannel).super_Channel.feedback[(long)(c + -9) + -10];
    }
    local_28->leftPan = (double)left;
    local_28->rightPan = (double)right;
  }
  return;
}

Assistant:

void OPL3::SetPanning(int c, float left, float right)
{
	if (FullPan)
	{
		Channel *channel;

		if (c < 9)
		{
			channel = channels[0][c];
		}
		else
		{
			channel = channels[1][c - 9];
		}
		channel->leftPan = left;
		channel->rightPan = right;
	}
}